

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3QuaternionTest.cpp
# Opt level: O1

void __thiscall SO3LimitMap::test_method(SO3LimitMap *this)

{
  double dVar1;
  double dVar2;
  size_t size;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  Index outer_stride;
  long lVar3;
  bool bVar4;
  VectorXd res;
  VectorXd expectedRes;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_198;
  double i;
  undefined **local_170;
  undefined1 local_168;
  undefined8 *local_160;
  char *local_158;
  undefined1 *local_150;
  VectorXd *local_148;
  byte local_140 [8];
  undefined8 local_138;
  shared_count sStack_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  double *local_f8;
  size_t sStack_f0;
  SO3<mnf::ExpMapQuaternion> S;
  undefined **local_40;
  undefined1 local_38;
  undefined8 *local_30;
  undefined1 **local_28;
  
  mnf::SO3<mnf::ExpMapQuaternion>::SO3(&S);
  size = mnf::Manifold::dim();
  res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  if ((long)size < 0) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (size != 0) {
    free((void *)0x0);
    if (size == 0) {
      res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
    }
    else {
      res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           Eigen::internal::conditional_aligned_new_auto<double,true>(size);
    }
  }
  local_f8 = res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = size;
  sStack_f0 = size;
  mnf::Manifold::limitMap(&S);
  expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  if (size != 0) {
    free((void *)0x0);
    if (size == 0) {
      expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x0;
    }
    else {
      expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           Eigen::internal::conditional_aligned_new_auto<double,true>(size);
    }
  }
  i = 1.8137993642342178;
  local_198.m_row = 0;
  local_198.m_col = 1;
  local_198.m_currentBlockRows = 1;
  expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = size
  ;
  local_198.m_xpr = &expectedRes;
  if (size == 0) {
    __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                  "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  *expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       1.8137993642342178;
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                      (&local_198,&i);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(this_00,&i);
  if ((local_198.m_currentBlockRows + local_198.m_row !=
       ((local_198.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
       .m_rows) || (local_198.m_col != 1)) {
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x7f);
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_00135a50;
  local_160 = &boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  if (expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                  "Eigen::CwiseBinaryOp<Eigen::numext::equal_to<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::numext::equal_to<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows < 1) {
    local_140[0] = 1;
  }
  else {
    lVar3 = 0;
    do {
      dVar1 = expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data[lVar3];
      dVar2 = res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
              [lVar3];
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar4 = res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows +
              -1 != lVar3;
      lVar3 = lVar3 + 1;
    } while (bVar4);
    local_140[0] = -(dVar1 == dVar2) & 1;
  }
  local_138 = 0;
  sStack_130.pi_ = (sp_counted_base *)0x0;
  local_108 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/SO3QuaternionTest.cpp"
  ;
  local_100 = "";
  local_198.m_currentBlockRows = (Index)&local_148;
  local_198.m_row = local_198.m_row & 0xffffffffffffff00;
  local_198.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)&PTR__lazy_ostream_00135c08;
  local_198.m_col = (Index)&boost::unit_test::lazy_ostream::inst;
  local_28 = &local_150;
  local_38 = 0;
  local_40 = &PTR__lazy_ostream_00135c08;
  local_30 = &boost::unit_test::lazy_ostream::inst;
  local_150 = (undefined1 *)&res;
  local_148 = &expectedRes;
  boost::test_tools::tt_detail::report_assertion
            (local_140,&local_170,&local_108,0x7f,1,2,2,"expectedRes",&local_198,"res",&local_40);
  boost::detail::shared_count::~shared_count(&sStack_130);
  free(expectedRes.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(res.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  S._0_8_ = &PTR__SO3_00135670;
  mnf::ReusableTemporaryMap::~ReusableTemporaryMap(&S.bufferMap_);
  mnf::Manifold::~Manifold(&S.super_Manifold);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SO3LimitMap)
{
  SO3<ExpMapQuaternion> S;
  Index dim = S.dim();
  Eigen::VectorXd res(dim);
  S.limitMap(res);
  Eigen::VectorXd expectedRes(dim);
  double i = M_PI / sqrt(3);
  expectedRes << i, i, i;
  BOOST_CHECK_EQUAL(expectedRes, res);
}